

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall mario::TimerQueue::cancelInLoop(TimerQueue *this,TimerId timerId)

{
  Timer *this_00;
  bool bVar1;
  pointer ppVar2;
  Timestamp local_60;
  pair<mario::Timestamp,_mario::Timer_*> local_58;
  size_type local_48;
  size_t n;
  _Self local_38;
  iterator it;
  ActiveTimer timer;
  TimerQueue *this_local;
  TimerId timerId_local;
  
  timerId_local._value = (Timer *)timerId._seq;
  this_local = (TimerQueue *)timerId._value;
  EventLoop::assertInLoopThread(this->_loop);
  std::pair<mario::Timer_*,_long>::pair<mario::Timer_*&,_long_&,_true>
            ((pair<mario::Timer_*,_long> *)&it,(Timer **)&this_local,(long *)&timerId_local);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<std::pair<mario::Timer_*,_long>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
       ::find(&this->_activeTimers,(key_type *)&it);
  n = (size_t)std::
              set<std::pair<mario::Timer_*,_long>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
              ::end(&this->_activeTimers);
  bVar1 = std::operator!=(&local_38,(_Self *)&n);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<mario::Timer_*,_long>_>::operator->(&local_38);
    local_60 = Timer::expiration(ppVar2->first);
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<mario::Timer_*,_long>_>::operator->(&local_38);
    std::pair<mario::Timestamp,_mario::Timer_*>::pair<mario::Timestamp,_true>
              (&local_58,&local_60,&ppVar2->first);
    local_48 = std::
               set<std::pair<mario::Timestamp,_mario::Timer_*>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
               ::erase(&this->_timers,&local_58);
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<mario::Timer_*,_long>_>::operator->(&local_38);
    this_00 = ppVar2->first;
    if (this_00 != (Timer *)0x0) {
      Timer::~Timer(this_00);
      operator_delete(this_00);
    }
    std::
    set<std::pair<mario::Timer*,long>,std::less<std::pair<mario::Timer*,long>>,std::allocator<std::pair<mario::Timer*,long>>>
    ::erase_abi_cxx11_((set<std::pair<mario::Timer*,long>,std::less<std::pair<mario::Timer*,long>>,std::allocator<std::pair<mario::Timer*,long>>>
                        *)&this->_activeTimers,(const_iterator)local_38._M_node);
  }
  else if ((this->_callingExpiredTimers & 1U) != 0) {
    std::
    set<std::pair<mario::Timer_*,_long>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
    ::insert(&this->_cancelingTimers,(value_type *)&it);
  }
  return;
}

Assistant:

void TimerQueue::cancelInLoop(TimerId timerId) {
    _loop->assertInLoopThread();
    ActiveTimer timer(timerId._value, timerId._seq);
    auto it = _activeTimers.find(timer);
    if (it != _activeTimers.end()) {
        size_t n = _timers.erase(Entry(it->first->expiration(), it->first));
        delete it->first;
        _activeTimers.erase(it);
    } else if (_callingExpiredTimers) {
        // 自cancel逻辑
        _cancelingTimers.insert(timer);
    }
}